

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O2

void __thiscall OSToken::OSToken(OSToken *this,string *inTokenPath,int inUmask)

{
  string *__lhs;
  _Rb_tree_header *p_Var1;
  int inUmask_00;
  bool bVar2;
  Directory *this_00;
  Generation *pGVar3;
  ObjectFile *this_01;
  MutexFactory *this_02;
  Mutex *pMVar4;
  int __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  (this->super_ObjectStoreToken)._vptr_ObjectStoreToken = (_func_int **)&PTR_setSOPIN_0014ee60;
  __lhs = &this->tokenPath;
  (this->tokenPath)._M_dataplus._M_p = (pointer)&(this->tokenPath).field_2;
  (this->tokenPath)._M_string_length = 0;
  (this->tokenPath).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->allObjects)._M_t._M_impl.super__Rb_tree_header;
  (this->allObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->allObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->allObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->currentFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->currentFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->currentFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->currentFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->currentFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->currentFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)__lhs);
  this->umask = inUmask;
  this_00 = (Directory *)operator_new(0x68);
  std::__cxx11::string::string((string *)&local_48,(string *)__lhs);
  Directory::Directory(this_00,&local_48);
  this->tokenDir = this_00;
  std::__cxx11::string::~string((string *)&local_48);
  std::operator+(&bStack_e8,__lhs,"/");
  std::operator+(&local_68,&bStack_e8,"generation");
  pGVar3 = Generation::create(&local_68,this->umask,true);
  this->gen = pGVar3;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&bStack_e8);
  this_01 = (ObjectFile *)operator_new(0xb0);
  std::operator+(&bStack_e8,__lhs,"/");
  std::operator+(&local_88,&bStack_e8,"token.object");
  inUmask_00 = this->umask;
  std::operator+(&local_c8,__lhs,"/");
  std::operator+(&local_a8,&local_c8,"token.lock");
  ObjectFile::ObjectFile(this_01,this,&local_88,inUmask_00,&local_a8,false);
  this->tokenObject = this_01;
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&bStack_e8);
  this_02 = MutexFactory::i();
  pMVar4 = MutexFactory::getMutex(this_02);
  this->tokenMutex = pMVar4;
  bVar2 = false;
  if ((pMVar4 != (Mutex *)0x0) && (this->gen != (Generation *)0x0)) {
    bVar2 = Directory::isValid(this->tokenDir);
    if (bVar2) {
      bVar2 = this->tokenObject->valid;
    }
    else {
      bVar2 = false;
    }
  }
  this->valid = bVar2;
  softHSMLog(7,"OSToken",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
             ,0x41,"Opened token %s",(this->tokenPath)._M_dataplus._M_p);
  index(this,(char *)0x1,__c);
  return;
}

Assistant:

OSToken::OSToken(const std::string inTokenPath, int inUmask)
{
	tokenPath = inTokenPath;
	umask = inUmask;

	tokenDir = new Directory(tokenPath);
	gen = Generation::create(tokenPath + OS_PATHSEP + "generation", umask, true);
	tokenObject = new ObjectFile(this, tokenPath + OS_PATHSEP + "token.object", umask, tokenPath + OS_PATHSEP + "token.lock");
	tokenMutex = MutexFactory::i()->getMutex();
	valid = (gen != NULL) && (tokenMutex != NULL) && tokenDir->isValid() && tokenObject->valid;

	DEBUG_MSG("Opened token %s", tokenPath.c_str());

	index(true);
}